

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::CheckImportedLibName(cmTarget *this,string *prop,string *value)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) && (this->IsImportedTarget != false)) {
    if (value->_M_string_length != 0) {
      if (*(value->_M_dataplus)._M_p == '-') {
        pcVar1 = this->Makefile;
        pcVar2 = (prop->_M_dataplus)._M_p;
        local_d0 = &local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar2,pcVar2 + prop->_M_string_length);
        std::__cxx11::string::append((char *)&local_d0);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_d0,(ulong)(value->_M_dataplus)._M_p);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_a0 = *plVar7;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar7;
          local_b0 = (long *)*plVar4;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0.field_2._8_8_ = plVar4[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar8;
          local_f0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_f0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        _Var12._M_p = (pointer)local_d0;
        if (local_d0 != &local_c0) goto LAB_0033672e;
        goto LAB_00336736;
      }
      lVar5 = std::__cxx11::string::find_first_of((char *)value,0x4a9930,0);
      if (lVar5 == -1) goto LAB_00336b08;
      pcVar1 = this->Makefile;
      pcVar2 = (prop->_M_dataplus)._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + prop->_M_string_length);
      std::__cxx11::string::append((char *)local_70);
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_70,(ulong)(value->_M_dataplus)._M_p);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_40 = *plVar7;
        lStack_38 = plVar4[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar7;
        local_50 = (long *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar9) {
        local_c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_c0._8_8_ = plVar4[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar4;
      }
      local_c8 = plVar4[1];
      *plVar4 = (long)paVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
      uVar10 = 0xf;
      if (local_d0 != &local_c0) {
        uVar10 = local_c0._M_allocated_capacity;
      }
      if ((ulong)uVar10 < (ulong)(local_88 + local_c8)) {
        uVar11 = 0xf;
        if (local_90 != local_80) {
          uVar11 = local_80[0];
        }
        if (uVar11 < (ulong)(local_88 + local_c8)) goto LAB_00336992;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_00336992:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
      }
      local_b0 = &local_a0;
      plVar4 = puVar6 + 2;
      if ((long *)*puVar6 == plVar4) {
        local_a0 = *plVar4;
        lStack_98 = puVar6[3];
      }
      else {
        local_a0 = *plVar4;
        local_b0 = (long *)*puVar6;
      }
      local_a8 = puVar6[1];
      *puVar6 = plVar4;
      puVar6[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0.field_2._8_8_ = plVar4[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar8;
        local_f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_f0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      if (lVar5 != -1) goto LAB_00336736;
    }
LAB_00336b08:
    bVar3 = true;
  }
  else {
    pcVar1 = this->Makefile;
    pcVar2 = (prop->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + prop->_M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
    local_c0._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var12._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_0033672e:
      operator_delete(_Var12._M_p,local_c0._M_allocated_capacity + 1);
    }
LAB_00336736:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmTarget::CheckImportedLibName(std::string const& prop,
                                    std::string const& value) const
{
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY ||
      !this->IsImported()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      prop +
        " property may be set only on imported INTERFACE library targets.");
    return false;
  }
  if (!value.empty()) {
    if (value[0] == '-') {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   prop + " property value\n  " + value +
                                     "\nmay not start with '-'.");
      return false;
    }
    std::string::size_type bad = value.find_first_of(":/\\;");
    if (bad != std::string::npos) {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                   prop + " property value\n  " + value +
                                     "\nmay not contain '" +
                                     value.substr(bad, 1) + "'.");
      return false;
    }
  }
  return true;
}